

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O2

void deqp::egl::anon_unknown_4::finish(Functions *gl,EGLint api)

{
  NotSupportedError *this;
  allocator<char> local_39;
  string local_38;
  
  if ((api != 0x40) && (api != 4)) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Unsupported API",&local_39);
    tcu::NotSupportedError::NotSupportedError(this,&local_38);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (*gl->finish)();
  return;
}

Assistant:

static void finish (const glw::Functions& gl, EGLint api)
{
	switch (api)
	{
		case EGL_OPENGL_ES2_BIT:
		case EGL_OPENGL_ES3_BIT_KHR:
			gl.finish();
			break;

		default:
			throw tcu::NotSupportedError("Unsupported API");
	}
}